

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_reg_t to_reg(MIR_context_t ctx,uint64_t reg_str_num,MIR_item_t_conflict func)

{
  MIR_reg_t MVar1;
  MIR_str_t MVar2;
  char *local_30;
  char *s;
  MIR_item_t_conflict func_local;
  uint64_t reg_str_num_local;
  MIR_context_t ctx_local;
  
  MVar2 = to_str(ctx,reg_str_num);
  local_30 = MVar2.s;
  process_reserved_name(local_30,"t",&((func->u).func)->last_temp_num);
  MVar1 = MIR_reg(ctx,local_30,(func->u).func);
  return MVar1;
}

Assistant:

static MIR_reg_t to_reg (MIR_context_t ctx, uint64_t reg_str_num, MIR_item_t func) {
  const char *s = to_str (ctx, reg_str_num).s;

  process_reserved_name (s, TEMP_REG_NAME_PREFIX, &func->u.func->last_temp_num);
  return MIR_reg (ctx, s, func->u.func);
}